

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O1

void * clone_new(t_symbol *s,int argc,t_atom *argv)

{
  char *__s1;
  int iVar1;
  int oldstate;
  int iVar2;
  int iVar3;
  t_clone *x;
  t_atom *ptVar4;
  _glist *x_00;
  t_copy *ptVar5;
  t_in *ptVar6;
  t_out **pptVar7;
  t_object *sink;
  _outlet *p_Var8;
  ulong uVar9;
  long lVar10;
  t_symbol *ptVar11;
  t_symbol *s1;
  long lVar12;
  bool bVar13;
  t_float tVar14;
  
  x = (t_clone *)pd_new(clone_class);
  iVar1 = clone_voicetovis;
  uVar9 = (ulong)(uint)clone_voicetovis;
  x->x_invec = (t_in *)0x0;
  x->x_outvec = (t_out **)0x0;
  x->x_startvoice = 0;
  x->x_suppressvoice = 0;
  clone_voicetovis = -1;
  if (argc == 0) {
    x->x_vec = (t_copy *)0x0;
    x->x_n = 0;
    return x;
  }
  oldstate = canvas_suspend_dsp();
  if (0 < argc) {
    do {
      if ((argv->a_type != A_SYMBOL) || (__s1 = ((argv->a_w).w_symbol)->s_name, *__s1 != '-'))
      break;
      iVar2 = strcmp(__s1,"-s");
      if ((argc == 1) || ((iVar2 != 0 || (argv[1].a_type != A_FLOAT)))) {
        iVar2 = strcmp(__s1,"-x");
        if (iVar2 != 0) goto LAB_0013bac3;
        x->x_suppressvoice = 1;
        lVar10 = 0x10;
        iVar2 = -1;
      }
      else {
        x->x_startvoice = (int)argv[1].a_w.w_float;
        lVar10 = 0x20;
        iVar2 = -2;
      }
      argv = (t_atom *)((long)&argv->a_type + lVar10);
      bVar13 = SCARRY4(argc,iVar2);
      argc = argc + iVar2;
    } while (argc != 0 && bVar13 == argc < 0);
  }
  if (argc < 2) {
LAB_0013bac3:
    pd_error((void *)0x0,"usage: clone [-s starting-number] <number> <name> [arguments]");
  }
  else {
    tVar14 = atom_getfloatarg(0,argc,argv);
    iVar2 = (int)tVar14;
    if ((iVar2 < 0) || (lVar10 = 0x18, argv[1].a_type != A_SYMBOL)) {
      tVar14 = atom_getfloatarg(1,argc,argv);
      iVar2 = (int)tVar14;
      if ((iVar2 < 0) || (lVar10 = 8, argv->a_type != A_SYMBOL)) goto LAB_0013bac3;
    }
    x->x_s = *(t_symbol **)((long)&argv->a_type + lVar10);
    x->x_argc = argc + -1;
    ptVar4 = (t_atom *)getbytes((long)argc * 0x10 - 0x10);
    x->x_argv = ptVar4;
    memcpy(ptVar4,argv + 1,(long)x->x_argc << 4);
    ptVar4 = x->x_argv;
    ptVar4->a_type = A_FLOAT;
    (ptVar4->a_w).w_float = (float)x->x_startvoice;
    x_00 = clone_makeone(x->x_s,x->x_argc - x->x_suppressvoice,x->x_argv + x->x_suppressvoice);
    if (x_00 != (_glist *)0x0) {
      ptVar5 = (t_copy *)getbytes(0x10);
      x->x_vec = ptVar5;
      ptVar5->c_gl = x_00;
      x->x_n = 1;
      iVar3 = obj_ninlets(&x_00->gl_obj);
      x->x_nin = iVar3;
      ptVar6 = (t_in *)getbytes((long)iVar3 * 0x18);
      x->x_invec = ptVar6;
      if (0 < x->x_nin) {
        lVar10 = 0;
        lVar12 = 0;
        do {
          ptVar6 = x->x_invec;
          *(_class **)((long)&ptVar6->i_pd + lVar10) = clone_in_class;
          *(t_clone **)((long)&ptVar6->i_owner + lVar10) = x;
          iVar3 = obj_issignalinlet(&x->x_vec->c_gl->gl_obj,(int)lVar12);
          ptVar6 = x->x_invec;
          *(int *)((long)&ptVar6->i_signal + lVar10) = iVar3;
          *(int *)((long)&ptVar6->i_n + lVar10) = (int)lVar12;
          if (iVar3 == 0) {
            s1 = (t_symbol *)0x0;
            ptVar11 = (t_symbol *)0x0;
          }
          else {
            s1 = &s_signal;
            ptVar11 = &s_signal;
          }
          inlet_new((t_object *)x,(t_pd *)((long)&ptVar6->i_pd + lVar10),s1,ptVar11);
          lVar12 = lVar12 + 1;
          lVar10 = lVar10 + 0x18;
        } while (lVar12 < x->x_nin);
      }
      iVar3 = obj_noutlets(&x->x_vec->c_gl->gl_obj);
      x->x_nout = iVar3;
      pptVar7 = (t_out **)getbytes(8);
      x->x_outvec = pptVar7;
      sink = (t_object *)getbytes((long)x->x_nout * 0x18);
      *x->x_outvec = (t_out *)sink;
      if (0 < x->x_nout) {
        lVar10 = 0;
        do {
          (sink->te_g).g_pd = clone_out_class;
          iVar3 = obj_issignaloutlet(&x->x_vec->c_gl->gl_obj,(int)lVar10);
          *(int *)&sink->te_binbuf = iVar3;
          *(int *)((long)&sink->te_binbuf + 4) = x->x_startvoice;
          if (iVar3 == 0) {
            ptVar11 = (t_symbol *)0x0;
          }
          else {
            ptVar11 = &s_signal;
          }
          p_Var8 = outlet_new((t_object *)x,ptVar11);
          (sink->te_g).g_next = (_gobj *)p_Var8;
          obj_connect(&x->x_vec->c_gl->gl_obj,(int)lVar10,sink,0);
          lVar10 = lVar10 + 1;
          sink = (t_object *)&sink->te_outlet;
        } while (lVar10 < x->x_nout);
      }
      clone_setn(x,(float)iVar2);
      x->x_phase = iVar2 + -1;
      canvas_resume_dsp(oldstate);
      if (iVar1 < 0) {
        return x;
      }
      if (x->x_n <= iVar1) {
        return x;
      }
      canvas_vis(x->x_vec[uVar9].c_gl,1.0);
      return x;
    }
  }
  freebytes(x,0x88);
  canvas_resume_dsp(oldstate);
  return (void *)0x0;
}

Assistant:

static void *clone_new(t_symbol *s, int argc, t_atom *argv)
{
    t_clone *x = (t_clone *)pd_new(clone_class);
    t_canvas *c;
    int wantn, dspstate, i, voicetovis = clone_voicetovis;
    t_out *outvec;
    x->x_invec = 0;
    x->x_outvec = 0;
    x->x_startvoice = 0;
    x->x_suppressvoice = 0;
    clone_voicetovis = -1;
    if (argc == 0)
    {
        x->x_vec = 0;
        x->x_n = 0;
        return (x);
    }
    dspstate = canvas_suspend_dsp();
    while (argc > 0 && argv[0].a_type == A_SYMBOL &&
        argv[0].a_w.w_symbol->s_name[0] == '-')
    {
        if (!strcmp(argv[0].a_w.w_symbol->s_name, "-s") && argc > 1 &&
            argv[1].a_type == A_FLOAT)
        {
            x->x_startvoice = argv[1].a_w.w_float;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(argv[0].a_w.w_symbol->s_name, "-x"))
            x->x_suppressvoice = 1, argc--, argv++;
        else goto usage;
    }
    if (argc >= 2 && (wantn = atom_getfloatarg(0, argc, argv)) >= 0
        && argv[1].a_type == A_SYMBOL)
            x->x_s = argv[1].a_w.w_symbol;
    else if (argc >= 2 && (wantn = atom_getfloatarg(1, argc, argv)) >= 0
        && argv[0].a_type == A_SYMBOL)
            x->x_s = argv[0].a_w.w_symbol;
    else goto usage;
        /* store a copy of the argmuents with an extra space (argc+1) for
        supplying an instance number, which we'll bash as we go. */
    x->x_argc = argc - 1;
    x->x_argv = getbytes(x->x_argc * sizeof(*x->x_argv));
    memcpy(x->x_argv, argv+1, x->x_argc * sizeof(*x->x_argv));
    SETFLOAT(x->x_argv, x->x_startvoice);
    if (!(c = clone_makeone(x->x_s, x->x_argc - x->x_suppressvoice,
        x->x_argv + x->x_suppressvoice)))
            goto fail;
    x->x_vec = (t_copy *)getbytes(sizeof(*x->x_vec));
    x->x_vec[0].c_gl = c;
    x->x_n = 1;
    x->x_nin = obj_ninlets(&x->x_vec[0].c_gl->gl_obj);
    x->x_invec = (t_in *)getbytes(x->x_nin * sizeof(*x->x_invec));
    for (i = 0; i < x->x_nin; i++)
    {
        x->x_invec[i].i_pd = clone_in_class;
        x->x_invec[i].i_owner = x;
        x->x_invec[i].i_signal =
            obj_issignalinlet(&x->x_vec[0].c_gl->gl_obj, i);
        x->x_invec[i].i_n = i;
        if (x->x_invec[i].i_signal)
            inlet_new(&x->x_obj, &x->x_invec[i].i_pd,
                &s_signal, &s_signal);
        else inlet_new(&x->x_obj, &x->x_invec[i].i_pd, 0, 0);
    }
    x->x_nout = obj_noutlets(&x->x_vec[0].c_gl->gl_obj);
    x->x_outvec = (t_out **)getbytes(sizeof(*x->x_outvec));
    x->x_outvec[0] = outvec =
        (t_out *)getbytes(x->x_nout * sizeof(*outvec));
    for (i = 0; i < x->x_nout; i++)
    {
        outvec[i].o_pd = clone_out_class;
        outvec[i].o_signal =
            obj_issignaloutlet(&x->x_vec[0].c_gl->gl_obj, i);
        outvec[i].o_n = x->x_startvoice;
        outvec[i].o_outlet =
            outlet_new(&x->x_obj, (outvec[i].o_signal ? &s_signal : 0));
        obj_connect(&x->x_vec[0].c_gl->gl_obj, i,
            (t_object *)(&outvec[i]), 0);
    }
    clone_setn(x, (t_floatarg)(wantn));
    x->x_phase = wantn-1;
    canvas_resume_dsp(dspstate);
    if (voicetovis >= 0 && voicetovis < x->x_n)
        canvas_vis(x->x_vec[voicetovis].c_gl, 1);
    return (x);
usage:
    pd_error(0, "usage: clone [-s starting-number] <number> <name> [arguments]");
fail:
    freebytes(x, sizeof(t_clone));
    canvas_resume_dsp(dspstate);
    return (0);
}